

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

int * __thiscall CSnapshotBuilder::GetItemData(CSnapshotBuilder *this,int Key)

{
  int iVar1;
  CSnapshotItem *pCVar2;
  int *piVar3;
  int in_ESI;
  CSnapshotBuilder *in_RDI;
  int i;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (in_RDI->m_NumItems <= local_18) {
      return (int *)0x0;
    }
    pCVar2 = GetItem(in_RDI,local_18);
    iVar1 = CSnapshotItem::Key(pCVar2);
    if (iVar1 == in_ESI) break;
    local_18 = local_18 + 1;
  }
  pCVar2 = GetItem(in_RDI,local_18);
  piVar3 = CSnapshotItem::Data(pCVar2);
  return piVar3;
}

Assistant:

int *CSnapshotBuilder::GetItemData(int Key) const
{
	for(int i = 0; i < m_NumItems; i++)
	{
		if(GetItem(i)->Key() == Key)
			return GetItem(i)->Data();
	}
	return 0;
}